

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

void __thiscall DomLayout::~DomLayout(DomLayout *this)

{
  QList<DomProperty_*> *this_00;
  QList<DomProperty_*> *this_01;
  const_iterator cVar1;
  const_iterator begin;
  Data *pDVar2;
  Data *pDVar3;
  Data *pDVar4;
  
  this_00 = &this->m_property;
  cVar1.i = (this->m_property).d.ptr;
  qDeleteAll<QList<DomProperty*>::const_iterator>
            (cVar1,(const_iterator)(cVar1.i + (this->m_property).d.size));
  QList<DomProperty_*>::clear(this_00);
  this_01 = &this->m_attribute;
  cVar1.i = (this->m_attribute).d.ptr;
  qDeleteAll<QList<DomProperty*>::const_iterator>
            (cVar1,(const_iterator)(cVar1.i + (this->m_attribute).d.size));
  QList<DomProperty_*>::clear(this_01);
  begin.i = (this->m_item).d.ptr;
  qDeleteAll<QList<DomLayoutItem*>::const_iterator>
            (begin,(const_iterator)(begin.i + (this->m_item).d.size));
  QList<DomLayoutItem_*>::clear(&this->m_item);
  pDVar2 = (this->m_item).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_item).d.d)->super_QArrayData,8,0x10);
    }
  }
  pDVar3 = (this_01->d).d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this_01->d).d)->super_QArrayData,8,0x10);
    }
  }
  pDVar3 = (this_00->d).d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this_00->d).d)->super_QArrayData,8,0x10);
    }
  }
  pDVar4 = (this->m_attr_columnMinimumWidth).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_attr_columnMinimumWidth).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar4 = (this->m_attr_rowMinimumHeight).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_attr_rowMinimumHeight).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar4 = (this->m_attr_columnStretch).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_attr_columnStretch).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar4 = (this->m_attr_rowStretch).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_attr_rowStretch).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar4 = (this->m_attr_stretch).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_attr_stretch).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar4 = (this->m_attr_name).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_attr_name).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar4 = (this->m_attr_class).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate(&((this->m_attr_class).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

DomLayout::~DomLayout()
{
    qDeleteAll(m_property);
    m_property.clear();
    qDeleteAll(m_attribute);
    m_attribute.clear();
    qDeleteAll(m_item);
    m_item.clear();
}